

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
libcellml::Units::unitAttributePrefix_abi_cxx11_
          (string *__return_storage_ptr__,Units *this,size_t index)

{
  string id;
  string ref;
  double mult;
  double exp;
  string local_78;
  string local_58;
  double local_38;
  double local_30;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  unitAttributes(this,index,&local_58,__return_storage_ptr__,&local_30,&local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Units::unitAttributePrefix(size_t index) const
{
    std::string ref;
    std::string pre;
    double exp;
    double mult;
    std::string id;
    unitAttributes(index, ref, pre, exp, mult, id);
    return pre;
}